

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

VarExtend * __thiscall kratos::Var::extend(Var *this,uint32_t width)

{
  bool bVar1;
  __shared_ptr_access<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  enable_shared_from_this<kratos::Var> local_50;
  undefined1 local_40 [8];
  shared_ptr<kratos::VarExtend> p;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>,_false>
  local_28;
  uint32_t local_1c;
  Var *pVStack_18;
  uint32_t width_local;
  Var *this_local;
  
  local_1c = width;
  pVStack_18 = this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::shared_ptr<kratos::VarExtend>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>_>_>
       ::find(&this->extended_,&local_1c);
  p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       unordered_map<unsigned_int,_std::shared_ptr<kratos::VarExtend>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>_>_>
       ::end(&this->extended_);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>,_false>
                      *)&p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
  if (bVar1) {
    this_00 = (__shared_ptr_access<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              unordered_map<unsigned_int,_std::shared_ptr<kratos::VarExtend>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>_>_>
              ::at(&this->extended_,&local_1c);
    this_local = (Var *)std::
                        __shared_ptr_access<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator*(this_00);
  }
  else {
    std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_50);
    std::make_shared<kratos::VarExtend,std::shared_ptr<kratos::Var>,unsigned_int&>
              ((shared_ptr<kratos::Var> *)local_40,(uint *)&local_50);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_50);
    std::
    unordered_map<unsigned_int,std::shared_ptr<kratos::VarExtend>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::VarExtend>>>>
    ::emplace<unsigned_int&,std::shared_ptr<kratos::VarExtend>&>
              ((unordered_map<unsigned_int,std::shared_ptr<kratos::VarExtend>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::VarExtend>>>>
                *)&this->extended_,&local_1c,(shared_ptr<kratos::VarExtend> *)local_40);
    this_local = (Var *)std::
                        __shared_ptr_access<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator*((__shared_ptr_access<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_40);
    std::shared_ptr<kratos::VarExtend>::~shared_ptr((shared_ptr<kratos::VarExtend> *)local_40);
  }
  return (VarExtend *)this_local;
}

Assistant:

VarExtend &Var::extend(uint32_t width) {
    if (extended_.find(width) != extended_.end()) {
        return *extended_.at(width);
    } else {
        auto p = std::make_shared<VarExtend>(shared_from_this(), width);
        extended_.emplace(width, p);
        return *p;
    }
}